

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkinformation.cpp
# Opt level: O2

QStringList * QNetworkInformationPrivate::backendNames(void)

{
  QNetworkInformationBackendFactory **ppQVar1;
  long asize;
  bool bVar2;
  Type *pTVar3;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_> *in_RDI;
  long lVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_78;
  QArrayDataPointer<QNetworkInformationBackendFactory_*> local_60;
  undefined1 local_48 [24];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pTVar3 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>::
           operator()(in_RDI);
  if ((pTVar3 == (Type *)0x0) || (bVar2 = initializeList(), !bVar2)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      *(undefined8 *)in_RDI = 0;
      *(undefined8 *)(in_RDI + 8) = 0;
      *(undefined8 *)(in_RDI + 0x10) = 0;
      return (QStringList *)in_RDI;
    }
  }
  else {
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pTVar3 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>::
             instance();
    QMutexLocker<QMutex>::QMutexLocker((QMutexLocker<QMutex> *)local_48,&pTVar3->instanceMutex);
    pTVar3 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>::
             instance();
    local_60.d = (pTVar3->factories).d.d;
    ppQVar1 = (pTVar3->factories).d.ptr;
    asize = (pTVar3->factories).d.size;
    if (local_60.d != (Data *)0x0) {
      LOCK();
      ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_60.ptr = ppQVar1;
    local_60.size = asize;
    QBasicMutex::unlock((QBasicMutex *)local_48._0_8_);
    local_48._8_8_ = local_48._8_8_ & 0xffffffffffffff00;
    *(undefined8 *)in_RDI = 0;
    *(undefined8 *)(in_RDI + 8) = 0;
    *(undefined8 *)(in_RDI + 0x10) = 0;
    QList<QString>::reserve((QList<QString> *)in_RDI,asize);
    for (lVar4 = 0; asize * 8 != lVar4; lVar4 = lVar4 + 8) {
      (**(code **)(**(long **)((long)ppQVar1 + lVar4) + 0x60))(&QStack_78);
      QList<QString>::emplaceBack<QString>((QList<QString> *)in_RDI,(QString *)&QStack_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_78);
    }
    QArrayDataPointer<QNetworkInformationBackendFactory_*>::~QArrayDataPointer(&local_60);
    QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return (QStringList *)in_RDI;
    }
  }
  __stack_chk_fail();
}

Assistant:

QStringList QNetworkInformationPrivate::backendNames()
{
    if (!dataHolder())
        return {};
    if (!initializeList())
        return {};

    QMutexLocker locker(&dataHolder->instanceMutex);
    const QList copy = dataHolder->factories;
    locker.unlock();

    QStringList result;
    result.reserve(copy.size());
    for (const auto *factory : copy)
        result << factory->name();
    return result;
}